

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int64_t expand(archive_read *a,int64_t end)

{
  byte bVar1;
  void *pvVar2;
  undefined8 uVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  long lVar13;
  byte *buf;
  rar_program_code *prog;
  uLong uVar14;
  uint8_t *puVar15;
  undefined4 extraout_var;
  long *plVar16;
  ulong uVar17;
  uint8_t uVar18;
  long *plVar19;
  long *plVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  void *pvVar24;
  size_t __size;
  void *pvVar25;
  uint64_t uVar26;
  ulong uVar27;
  size_t sVar28;
  undefined1 uVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  uint8_t flags;
  memory_bit_reader br;
  byte local_141;
  archive_read *local_140;
  byte local_131;
  ulong local_130;
  memory_bit_reader local_128;
  uint8_t *local_f8;
  rar_br *local_f0;
  uint32_t local_e4;
  long local_e0;
  memory_bit_reader local_d8;
  long *local_a8;
  void *local_a0;
  ulong local_98;
  long local_90;
  undefined8 *local_88;
  undefined8 *local_80;
  long local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  void *local_58;
  huffman_code *local_50;
  huffman_code *local_48;
  huffman_code *local_40;
  huffman_code *local_38;
  
  pvVar2 = a->format->data;
  local_f0 = (rar_br *)((long)pvVar2 + 0x4f30);
  local_e0 = end;
  if (*(long *)((long)pvVar2 + 0x3a8) < end) {
    local_e0 = *(long *)((long)pvVar2 + 0x3a8);
  }
  local_38 = (huffman_code *)((long)pvVar2 + 0x118);
  local_48 = (huffman_code *)((long)pvVar2 + 0x140);
  local_50 = (huffman_code *)((long)pvVar2 + 0x168);
  local_80 = (undefined8 *)((long)pvVar2 + 0x370);
  local_40 = (huffman_code *)((long)pvVar2 + 400);
  local_88 = (undefined8 *)((long)pvVar2 + 0x374);
  local_140 = a;
LAB_00151b9d:
  while( true ) {
    if (local_e0 <= *(long *)((long)pvVar2 + 0x360)) {
      return local_e0;
    }
    if (*(char *)((long)pvVar2 + 0x3d2) != '\0') {
      return *(long *)((long)pvVar2 + 0x360);
    }
    iVar6 = read_next_symbol(a,local_38);
    if (iVar6 < 0) {
      return -0x1e;
    }
    if (0xff < iVar6) break;
    *(char *)(*(long *)((long)pvVar2 + 0x350) +
             (long)(int)(*(uint *)((long)pvVar2 + 0x358) & *(uint *)((long)pvVar2 + 0x360))) =
         (char)iVar6;
    lVar13 = 1;
LAB_0015219d:
    *(long *)((long)pvVar2 + 0x360) = *(long *)((long)pvVar2 + 0x360) + lVar13;
  }
  if (iVar6 == 0x100) {
    if (((*(int *)((long)pvVar2 + 0x4f38) < 1) &&
        (iVar6 = rar_br_fillup(local_140,local_f0), iVar6 == 0)) &&
       (*(int *)((long)pvVar2 + 0x4f38) < 1)) goto LAB_00152b34;
    a = local_140;
    iVar6 = *(int *)((long)pvVar2 + 0x4f38);
    uVar31 = iVar6 - 1;
    *(uint *)((long)pvVar2 + 0x4f38) = uVar31;
    if ((*(ulong *)((long)pvVar2 + 0x4f30) >> ((ulong)uVar31 & 0x3f) & 1) != 0) {
      iVar6 = parse_codes(local_140);
      if (iVar6 != 0) {
        return -0x1e;
      }
      goto LAB_00151b9d;
    }
    *(undefined1 *)((long)pvVar2 + 0xec) = 1;
    if (((1 < iVar6) || (iVar6 = rar_br_fillup(local_140,local_f0), iVar6 != 0)) ||
       (0 < *(int *)((long)pvVar2 + 0x4f38))) {
      uVar31 = *(int *)((long)pvVar2 + 0x4f38) - 1;
      *(bool *)((long)pvVar2 + 0x388) =
           (*(ulong *)((long)pvVar2 + 0x4f30) >> ((ulong)uVar31 & 0x3f) & 1) != 0;
      *(uint *)((long)pvVar2 + 0x4f38) = uVar31;
      return *(int64_t *)((long)pvVar2 + 0x360);
    }
LAB_00152b34:
    archive_set_error(&local_140->archive,0x54,"Truncated RAR file data");
    *(undefined1 *)((long)pvVar2 + 0xd0) = 0;
    return -0x1e;
  }
  if (iVar6 == 0x102) {
    uVar31 = *(uint *)((long)pvVar2 + 0x368);
    if (uVar31 != 0) {
      iVar30 = *(int *)((long)pvVar2 + 0x36c);
LAB_001520ea:
      *(int *)((long)pvVar2 + 0x36c) = iVar30;
      *(uint *)((long)pvVar2 + 0x368) = uVar31;
      if (0 < (int)uVar31) {
        uVar10 = *(uint *)((long)pvVar2 + 0x360) & *(uint *)((long)pvVar2 + 0x358);
        uVar21 = uVar10 - iVar30 & *(uint *)((long)pvVar2 + 0x358);
        uVar7 = uVar31;
        do {
          uVar32 = uVar21;
          if ((int)uVar21 < (int)uVar10) {
            uVar32 = uVar10;
          }
          uVar32 = (*(int *)((long)pvVar2 + 0x358) - uVar32) + 1;
          if ((int)uVar7 < (int)uVar32) {
            uVar32 = uVar7;
          }
          pvVar25 = (void *)((long)(int)uVar10 + *(long *)((long)pvVar2 + 0x350));
          pvVar24 = (void *)(*(long *)((long)pvVar2 + 0x350) + (long)(int)uVar21);
          if (((int)(uVar32 + uVar10) < (int)uVar21) || ((int)(uVar32 + uVar21) < (int)uVar10)) {
            memcpy(pvVar25,pvVar24,(long)(int)uVar32);
          }
          else if (0 < (int)uVar32) {
            uVar17 = 0;
            do {
              *(undefined1 *)((long)pvVar25 + uVar17) = *(undefined1 *)((long)pvVar24 + uVar17);
              uVar17 = uVar17 + 1;
            } while (uVar32 != uVar17);
          }
          uVar10 = uVar32 + uVar10 & *(uint *)((long)pvVar2 + 0x358);
          uVar21 = uVar32 + uVar21 & *(uint *)((long)pvVar2 + 0x358);
          uVar23 = uVar7 - uVar32;
          bVar4 = (int)uVar32 <= (int)uVar7;
          uVar7 = uVar23;
        } while (uVar23 != 0 && bVar4);
      }
      lVar13 = (long)(int)uVar31;
      a = local_140;
      goto LAB_0015219d;
    }
    goto LAB_00151b9d;
  }
  if (iVar6 == 0x101) {
    pvVar24 = a->format->data;
    iVar6 = rar_decode_byte(a,&local_131);
    bVar4 = true;
    if (iVar6 != 0) {
      local_130 = CONCAT44(local_130._4_4_,(uint)local_131);
      uVar31 = (local_131 & 7) + 1;
      if ((char)uVar31 == '\a') {
        iVar6 = rar_decode_byte(a,&local_141);
        if (iVar6 == 0) goto LAB_001529ef;
        uVar31 = local_141 + 7;
      }
      else if ((char)uVar31 == '\b') {
        iVar6 = rar_decode_byte(a,&local_141);
        bVar5 = local_141;
        if ((iVar6 == 0) || (iVar6 = rar_decode_byte(a,&local_141), a = local_140, iVar6 == 0))
        goto LAB_001529ef;
        uVar31 = (uint)CONCAT11(bVar5,local_141);
      }
      uVar17 = (ulong)uVar31;
      local_f8 = (uint8_t *)malloc(uVar17);
      if (local_f8 != (uint8_t *)0x0) {
        if (uVar17 != 0) {
          uVar22 = 0;
          do {
            iVar6 = rar_decode_byte(local_140,local_f8 + uVar22);
            if (iVar6 == 0) {
              free(local_f8);
              a = local_140;
              goto LAB_001529ef;
            }
            uVar22 = uVar22 + 1;
          } while (uVar17 != uVar22);
        }
        pvVar25 = local_140->format->data;
        local_128.offset = 0;
        local_128.bits = 0;
        local_128.available = 0;
        local_128.at_eof = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_128.bytes = local_f8;
        uVar31 = 0;
        for (lVar13 = *(long *)((long)pvVar25 + 0x398); lVar13 != 0;
            lVar13 = *(long *)(lVar13 + 0x30)) {
          uVar31 = uVar31 + 1;
        }
        local_128.length = uVar17;
        local_a0 = pvVar25;
        local_58 = pvVar24;
        if ((char)local_130 < '\0') {
          uVar11 = membr_next_rarvm_number(&local_128);
          if (uVar11 == 0) {
            delete_filter(*(rar_filter **)((long)pvVar25 + 0x3a0));
            uVar7 = 0;
            *(undefined8 *)((long)pvVar25 + 0x3a0) = 0;
            delete_program_code(*(rar_program_code **)((long)pvVar25 + 0x398));
            *(undefined8 *)((long)pvVar25 + 0x398) = 0;
          }
          else {
            uVar7 = uVar11 - 1;
          }
          a = local_140;
          if (uVar7 <= uVar31) {
            *(uint *)((long)local_a0 + 0x3b0) = uVar7;
            goto LAB_00152329;
          }
        }
        else {
          uVar7 = *(uint *)((long)pvVar25 + 0x3b0);
LAB_00152329:
          local_a8 = (long *)((long)local_a0 + 0x398);
          prog = (rar_program_code *)*local_a8;
          for (; uVar7 != 0; uVar7 = uVar7 - 1) {
            prog = prog->next;
          }
          if (prog != (rar_program_code *)0x0) {
            prog->usagecount = prog->usagecount + 1;
          }
          uVar11 = membr_next_rarvm_number(&local_128);
          local_90 = *(long *)((long)local_a0 + 0x360) + 0x102;
          if ((local_130 & 0x40) == 0) {
            local_90 = *(long *)((long)local_a0 + 0x360);
          }
          local_90 = local_90 + (ulong)uVar11;
          if ((local_130 & 0x20) == 0) {
            if (prog == (rar_program_code *)0x0) {
              uVar11 = 0;
            }
            else {
              uVar11 = prog->oldfilterlength;
            }
          }
          else {
            uVar11 = membr_next_rarvm_number(&local_128);
          }
          uStack_70 = CONCAT44(0x3c000,(undefined4)uStack_70);
          if (prog == (rar_program_code *)0x0) {
            uVar12 = 0;
          }
          else {
            uVar12 = prog->usagecount;
          }
          local_68 = CONCAT44(uVar12,uVar11);
          uStack_60 = CONCAT44(0x40000,(undefined4)uStack_60);
          if ((local_130 & 0x10) != 0) {
            if (local_128.available < 7) {
              uVar31 = 0;
              if (local_128.at_eof == 0) {
                iVar6 = local_128.available;
                if (local_128.offset < local_128.length) {
                  do {
                    uVar17 = local_128.offset + 1;
                    local_128.bits = (ulong)local_128.bytes[local_128.offset] | local_128.bits << 8;
                    local_128.available = iVar6 + 8;
                    local_128.offset = uVar17;
                    if (-2 < iVar6) goto LAB_00152462;
                    iVar6 = iVar6 + 8;
                  } while (uVar17 != local_128.length);
                }
                local_128.at_eof = 1;
              }
            }
            else {
LAB_00152462:
              iVar6 = local_128.available + -7;
              local_128.available = iVar6;
              uVar31 = (uint)(local_128.bits >> ((byte)iVar6 & 0x3f)) & 0x7f;
            }
            lVar13 = 0;
            do {
              if ((uVar31 >> ((uint)lVar13 & 0x1f) & 1) != 0) {
                uVar12 = membr_next_rarvm_number(&local_128);
                *(uint32_t *)((long)&local_78 + lVar13 * 4) = uVar12;
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 != 7);
          }
          a = local_140;
          local_e4 = uVar11;
          if (prog == (rar_program_code *)0x0) {
            uVar11 = membr_next_rarvm_number(&local_128);
            uVar17 = (ulong)uVar11;
            if ((uVar11 - 0x10001 < 0xffff0000) ||
               (buf = (byte *)malloc(uVar17), buf == (byte *)0x0)) {
LAB_00152779:
              bVar4 = false;
              prog = (rar_program_code *)0x0;
            }
            else {
              if (uVar11 != 0) {
                uVar22 = 0;
                uVar26 = local_128.bits;
                sVar28 = local_128.offset;
                iVar6 = local_128.available;
                iVar30 = local_128.at_eof;
                do {
                  if (iVar6 < 8) {
                    if (iVar30 == 0) {
                      uVar27 = sVar28;
                      iVar8 = iVar6;
                      if (sVar28 < local_128.length) {
                        do {
                          sVar28 = uVar27 + 1;
                          uVar26 = (ulong)local_128.bytes[uVar27] | uVar26 << 8;
                          iVar6 = iVar8 + 8;
                          local_128.available = iVar6;
                          local_128.offset = sVar28;
                          local_128.bits = uVar26;
                          if (-1 < iVar8) goto LAB_00152568;
                          uVar27 = sVar28;
                          iVar8 = iVar6;
                        } while (local_128.length != sVar28);
                      }
                      local_128.at_eof = 1;
                      iVar30 = 1;
                    }
                    bVar5 = 0;
                  }
                  else {
LAB_00152568:
                    iVar6 = iVar6 + -8;
                    local_128.available = iVar6;
                    bVar5 = (byte)(uVar26 >> ((byte)iVar6 & 0x3f));
                  }
                  buf[uVar22] = bVar5;
                  uVar22 = uVar22 + 1;
                } while (uVar22 != uVar17);
              }
              local_d8.offset = 0;
              local_d8.bits = 0;
              local_d8.bytes = (byte *)0x0;
              local_d8.length = 0;
              local_d8.available = 0;
              local_d8.at_eof = 0;
              if (uVar11 < 2) {
                bVar5 = 0;
              }
              else {
                uVar22 = 1;
                bVar5 = 0;
                do {
                  bVar5 = bVar5 ^ buf[uVar22];
                  uVar22 = uVar22 + 1;
                } while (uVar17 != uVar22);
              }
              local_98 = uVar17;
              if ((uVar11 == 0) || (bVar5 != *buf)) {
LAB_0015274c:
                prog = (rar_program_code *)0x0;
              }
              else {
                local_d8.offset = 1;
                local_d8.bytes = buf;
                local_d8.length = uVar17;
                prog = (rar_program_code *)calloc(1,0x38);
                if (prog == (rar_program_code *)0x0) goto LAB_0015274c;
                uVar14 = cm_zlib_z_crc32(0,buf,(uInt)local_98);
                prog->fingerprint = uVar17 << 0x20 | uVar14;
                if (local_d8.available < 1) {
                  a = local_140;
                  if (local_d8.at_eof == 0) {
                    iVar6 = local_d8.available;
                    if (local_d8.offset < local_d8.length) {
                      do {
                        uVar17 = local_d8.offset + 1;
                        local_d8.bits = (ulong)local_d8.bytes[local_d8.offset] | local_d8.bits << 8;
                        local_d8.available = iVar6 + 8;
                        local_d8.offset = uVar17;
                        if (-8 < iVar6) goto LAB_00152632;
                        iVar6 = iVar6 + 8;
                      } while (uVar17 != local_d8.length);
                    }
                    local_d8.at_eof = 1;
                  }
                }
                else {
LAB_00152632:
                  uVar31 = local_d8.available - 1;
                  local_d8.available = uVar31;
                  if ((local_d8.bits >> ((ulong)uVar31 & 0x3f) & 1) != 0) {
                    uVar11 = membr_next_rarvm_number(&local_d8);
                    uVar31 = uVar11 + 1;
                    prog->staticdatalen = uVar31;
                    puVar15 = (uint8_t *)malloc((ulong)uVar31);
                    prog->staticdata = puVar15;
                    if (puVar15 == (uint8_t *)0x0) {
                      delete_program_code(prog);
                      prog = (rar_program_code *)0x0;
                      a = local_140;
                    }
                    else {
                      a = local_140;
                      if (uVar31 != 0) {
                        uVar17 = 0;
                        do {
                          if (local_d8.available < 8) {
                            if (local_d8.at_eof == 0) {
                              iVar6 = local_d8.available;
                              if (local_d8.offset < local_d8.length) {
                                do {
                                  uVar22 = local_d8.offset + 1;
                                  local_d8.bits =
                                       (ulong)local_d8.bytes[local_d8.offset] | local_d8.bits << 8;
                                  local_d8.available = iVar6 + 8;
                                  local_d8.offset = uVar22;
                                  if (-1 < iVar6) goto LAB_00152715;
                                  iVar6 = iVar6 + 8;
                                } while (uVar22 != local_d8.length);
                              }
                              local_d8.at_eof = 1;
                            }
                            uVar18 = '\0';
                          }
                          else {
LAB_00152715:
                            iVar6 = local_d8.available + -8;
                            local_d8.available = iVar6;
                            uVar18 = (uint8_t)(local_d8.bits >> ((byte)iVar6 & 0x3f));
                          }
                          prog->staticdata[uVar17] = uVar18;
                          uVar17 = uVar17 + 1;
                        } while (uVar17 < prog->staticdatalen);
                      }
                    }
                  }
                }
              }
              free(buf);
              plVar16 = local_a8;
              if (prog == (rar_program_code *)0x0) goto LAB_00152779;
              do {
                plVar19 = plVar16;
                lVar13 = *plVar19;
                plVar16 = (long *)(lVar13 + 0x30);
              } while (lVar13 != 0);
              *plVar19 = (long)prog;
              bVar4 = true;
            }
            if (!bVar4) goto LAB_001529e2;
          }
          prog->oldfilterlength = local_e4;
          if ((local_130 & 8) == 0) {
            pvVar24 = (void *)0x0;
            uVar17 = 0;
          }
          else {
            uVar11 = membr_next_rarvm_number(&local_128);
            if ((0x1fc0 < uVar11) ||
               (local_130 = CONCAT44(extraout_var,uVar11), pvVar24 = malloc((ulong)(uVar11 + 0x40)),
               pvVar24 == (void *)0x0)) goto LAB_001529e2;
            uVar17 = local_130;
            if ((int)local_130 != 0) {
              uVar22 = 0;
              uVar26 = local_128.bits;
              sVar28 = local_128.offset;
              iVar6 = local_128.available;
              iVar30 = local_128.at_eof;
              do {
                if (iVar6 < 8) {
                  if (iVar30 == 0) {
                    uVar27 = sVar28;
                    iVar8 = iVar6;
                    a = local_140;
                    if (sVar28 < local_128.length) {
                      do {
                        sVar28 = uVar27 + 1;
                        uVar26 = (ulong)local_128.bytes[uVar27] | uVar26 << 8;
                        iVar6 = iVar8 + 8;
                        local_128.available = iVar6;
                        local_128.offset = sVar28;
                        local_128.bits = uVar26;
                        if (-1 < iVar8) goto LAB_00152868;
                        uVar27 = sVar28;
                        iVar8 = iVar6;
                      } while (local_128.length != sVar28);
                    }
                    local_128.at_eof = 1;
                    iVar30 = 1;
                    uVar29 = 0;
                  }
                  else {
                    uVar29 = 0;
                  }
                }
                else {
LAB_00152868:
                  iVar6 = iVar6 + -8;
                  local_128.available = iVar6;
                  uVar29 = (undefined1)(uVar26 >> ((byte)iVar6 & 0x3f));
                }
                *(undefined1 *)((long)pvVar24 + uVar22 + 0x40) = uVar29;
                uVar22 = uVar22 + 1;
              } while (uVar22 != (local_130 & 0xffffffff));
            }
          }
          if (local_128.at_eof == 0) {
            local_130 = uVar17;
            plVar16 = (long *)calloc(1,0x58);
            if (plVar16 == (long *)0x0) {
LAB_0015292a:
              plVar16 = (long *)0x0;
            }
            else {
              *plVar16 = (long)prog;
              __size = 0x40;
              if (0x40 < (uint)local_130) {
                __size = local_130 & 0xffffffff;
              }
              *(int *)(plVar16 + 6) = (int)__size;
              pvVar25 = calloc(1,__size);
              plVar16[5] = (long)pvVar25;
              local_a8 = plVar16;
              if (pvVar25 == (void *)0x0) goto LAB_0015292a;
              if (pvVar24 != (void *)0x0) {
                memcpy(pvVar25,pvVar24,local_130 & 0xffffffff);
              }
              local_a8[3] = local_68;
              local_a8[4] = uStack_60;
              local_a8[1] = local_78;
              local_a8[2] = uStack_70;
              local_a8[7] = local_90;
              *(uint32_t *)(local_a8 + 8) = local_e4;
              plVar16 = local_a8;
            }
            free(pvVar24);
            pvVar24 = local_58;
            if (plVar16 != (long *)0x0) {
              lVar13 = 0;
              do {
                *(undefined4 *)(plVar16[5] + lVar13 * 4) =
                     *(undefined4 *)((long)&local_78 + lVar13 * 4);
                lVar13 = lVar13 + 1;
              } while (lVar13 != 7);
              *(uint32_t *)(plVar16[5] + 0x1c) = local_e4;
              *(undefined4 *)(plVar16[5] + 0x20) = 0;
              *(uint32_t *)(plVar16[5] + 0x2c) = prog->usagecount;
              plVar19 = (long *)((long)local_a0 + 0x3a0);
              do {
                plVar20 = plVar19;
                lVar13 = *plVar20;
                plVar19 = (long *)(lVar13 + 0x50);
              } while (lVar13 != 0);
              *plVar20 = (long)plVar16;
              if (*(long *)(*(long *)((long)local_a0 + 0x3a0) + 0x50) == 0) {
                *(long *)((long)local_a0 + 0x3a8) = local_90;
              }
              free(local_f8);
              if (*(long *)((long)pvVar24 + 0x3a8) < local_e0) {
                local_e0 = *(long *)((long)pvVar24 + 0x3a8);
              }
              bVar4 = false;
              goto LAB_001529ef;
            }
          }
          else {
            free(pvVar24);
          }
        }
LAB_001529e2:
        free(local_f8);
        bVar4 = true;
      }
    }
LAB_001529ef:
    if (bVar4) {
      return -0x1e;
    }
    goto LAB_00151b9d;
  }
  if (iVar6 < 0x107) {
    uVar17 = (ulong)(iVar6 - 0x103);
    iVar30 = *(int *)((long)pvVar2 + uVar17 * 4 + 0x370);
    uVar7 = read_next_symbol(a,local_40);
    if (0x1c < uVar7) goto LAB_00152b17;
    uVar31 = ""[uVar7] + 2;
    if (7 < uVar7) {
      bVar5 = ""[uVar7];
      uVar7 = (uint)bVar5;
      if (*(int *)((long)pvVar2 + 0x4f38) < (int)(uint)bVar5) {
        local_f8 = (uint8_t *)CONCAT44(local_f8._4_4_,(uint)bVar5);
        iVar8 = rar_br_fillup(local_140,local_f0);
        uVar7 = (uint)local_f8;
        if ((iVar8 == 0) && (*(int *)((long)pvVar2 + 0x4f38) < (int)(uint)local_f8))
        goto LAB_00152b34;
      }
      iVar8 = *(int *)((long)pvVar2 + 0x4f38) - uVar7;
      uVar31 = ((uint)(*(ulong *)((long)pvVar2 + 0x4f30) >> ((byte)iVar8 & 0x3f)) &
               cache_masks[uVar7]) + uVar31;
      *(int *)((long)pvVar2 + 0x4f38) = iVar8;
    }
    if (0x103 < iVar6) {
      do {
        *(undefined4 *)((long)pvVar2 + uVar17 * 4 + 0x370) =
             *(undefined4 *)((long)pvVar2 + uVar17 * 4 + 0x36c);
        bVar4 = 1 < (long)uVar17;
        uVar17 = uVar17 - 1;
      } while (bVar4);
    }
  }
  else {
    if (iVar6 < 0x10f) {
      bVar5 = ""[iVar6 - 0x107U];
      bVar1 = "\x02\x02\x03\x04\x05\x06\x06\x06"[iVar6 - 0x107U];
      if (((*(int *)((long)pvVar2 + 0x4f38) < (int)(uint)bVar1) &&
          (iVar6 = rar_br_fillup(local_140,local_f0), iVar6 == 0)) &&
         (*(int *)((long)pvVar2 + 0x4f38) < (int)(uint)bVar1)) goto LAB_00152b34;
      uVar17 = *(ulong *)((long)pvVar2 + 0x4f30);
      iVar6 = *(int *)((long)pvVar2 + 0x4f38) - (uint)bVar1;
      *(int *)((long)pvVar2 + 0x4f38) = iVar6;
      uVar3 = *local_80;
      *(undefined4 *)(local_88 + 1) = *(undefined4 *)(local_80 + 1);
      *local_88 = uVar3;
      iVar30 = ((uint)(uVar17 >> ((byte)iVar6 & 0x3f)) & cache_masks[bVar1]) + bVar5 + 1;
      *(int *)((long)pvVar2 + 0x370) = iVar30;
      uVar31 = 2;
      goto LAB_001520ea;
    }
    if (299 < iVar6) {
LAB_00152b17:
      archive_set_error(&local_140->archive,0x54,"Bad RAR file data");
      return -0x1e;
    }
    uVar31 = iVar6 - 0x10f;
    iVar6 = ""[uVar31] + 3;
    if (7 < uVar31) {
      bVar5 = ""[uVar31];
      if (((*(int *)((long)pvVar2 + 0x4f38) < (int)(uint)bVar5) &&
          (iVar30 = rar_br_fillup(local_140,local_f0), iVar30 == 0)) &&
         (*(int *)((long)pvVar2 + 0x4f38) < (int)(uint)bVar5)) goto LAB_00152b34;
      iVar30 = *(int *)((long)pvVar2 + 0x4f38) - (uint)bVar5;
      iVar6 = ((uint)(*(ulong *)((long)pvVar2 + 0x4f30) >> ((byte)iVar30 & 0x3f)) &
              cache_masks[bVar5]) + iVar6;
      *(int *)((long)pvVar2 + 0x4f38) = iVar30;
    }
    uVar31 = read_next_symbol(local_140,local_48);
    if (0x3c < uVar31) goto LAB_00152b17;
    uVar17 = (ulong)uVar31;
    iVar30 = expand::offsetbases[uVar17] + 1;
    if (3 < uVar31) {
      bVar5 = ""[uVar17];
      if ((int)uVar31 < 10) {
        if (((*(int *)((long)pvVar2 + 0x4f38) < (int)(uint)bVar5) &&
            (iVar8 = rar_br_fillup(local_140,local_f0), iVar8 == 0)) &&
           (*(int *)((long)pvVar2 + 0x4f38) < (int)(uint)bVar5)) goto LAB_00152b34;
        iVar8 = *(int *)((long)pvVar2 + 0x4f38) - (uint)bVar5;
        iVar30 = ((uint)(*(ulong *)((long)pvVar2 + 0x4f30) >> ((byte)iVar8 & 0x3f)) &
                 cache_masks[bVar5]) + iVar30;
        *(int *)((long)pvVar2 + 0x4f38) = iVar8;
      }
      else {
        if (uVar17 - 0xc < 0x30) {
          iVar8 = bVar5 - 4;
          if (((*(int *)((long)pvVar2 + 0x4f38) < iVar8) &&
              (iVar9 = rar_br_fillup(local_140,local_f0), iVar9 == 0)) &&
             (*(int *)((long)pvVar2 + 0x4f38) < iVar8)) goto LAB_00152b34;
          iVar8 = *(int *)((long)pvVar2 + 0x4f38) - iVar8;
          iVar30 = ((uint)(*(ulong *)((long)pvVar2 + 0x4f30) >> ((byte)iVar8 & 0x3f)) &
                   *(uint *)("" + (ulong)bVar5 * 4 + 1)) * 0x10 + iVar30;
          *(int *)((long)pvVar2 + 0x4f38) = iVar8;
        }
        if (*(int *)((long)pvVar2 + 900) == 0) {
          iVar8 = read_next_symbol(local_140,local_50);
          if (iVar8 < 0) {
            return -0x1e;
          }
          if (iVar8 != 0x10) {
            iVar30 = iVar30 + iVar8;
            *(int *)((long)pvVar2 + 0x380) = iVar8;
            goto LAB_001520a8;
          }
          *(undefined4 *)((long)pvVar2 + 900) = 0xf;
        }
        else {
          *(int *)((long)pvVar2 + 900) = *(int *)((long)pvVar2 + 900) + -1;
        }
        iVar30 = iVar30 + *(int *)((long)pvVar2 + 0x380);
      }
    }
LAB_001520a8:
    uVar3 = *local_80;
    *(undefined4 *)(local_88 + 1) = *(undefined4 *)(local_80 + 1);
    *local_88 = uVar3;
    uVar31 = iVar6 + (uint)(0x3ffff < iVar30) + (uint)(0x1fff < iVar30);
  }
  *(int *)((long)pvVar2 + 0x370) = iVar30;
  goto LAB_001520ea;
}

Assistant:

static int64_t
expand(struct archive_read *a, int64_t end)
{
  static const unsigned char lengthbases[] =
    {   0,   1,   2,   3,   4,   5,   6,
        7,   8,  10,  12,  14,  16,  20,
       24,  28,  32,  40,  48,  56,  64,
       80,  96, 112, 128, 160, 192, 224 };
  static const unsigned char lengthbits[] =
    { 0, 0, 0, 0, 0, 0, 0,
      0, 1, 1, 1, 1, 2, 2,
      2, 2, 3, 3, 3, 3, 4,
      4, 4, 4, 5, 5, 5, 5 };
  static const int lengthb_min = minimum(
    (int)(sizeof(lengthbases)/sizeof(lengthbases[0])),
    (int)(sizeof(lengthbits)/sizeof(lengthbits[0]))
  );
  static const unsigned int offsetbases[] =
    {       0,       1,       2,       3,       4,       6,
            8,      12,      16,      24,      32,      48,
           64,      96,     128,     192,     256,     384,
          512,     768,    1024,    1536,    2048,    3072,
         4096,    6144,    8192,   12288,   16384,   24576,
        32768,   49152,   65536,   98304,  131072,  196608,
       262144,  327680,  393216,  458752,  524288,  589824,
       655360,  720896,  786432,  851968,  917504,  983040,
      1048576, 1310720, 1572864, 1835008, 2097152, 2359296,
      2621440, 2883584, 3145728, 3407872, 3670016, 3932160 };
  static const unsigned char offsetbits[] =
    {  0,  0,  0,  0,  1,  1,  2,  2,  3,  3,  4,  4,
       5,  5,  6,  6,  7,  7,  8,  8,  9,  9, 10, 10,
      11, 11, 12, 12, 13, 13, 14, 14, 15, 15, 16, 16,
      16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16,
      18, 18, 18, 18, 18, 18, 18, 18, 18, 18, 18, 18 };
  static const int offsetb_min = minimum(
    (int)(sizeof(offsetbases)/sizeof(offsetbases[0])),
    (int)(sizeof(offsetbits)/sizeof(offsetbits[0]))
  );
  static const unsigned char shortbases[] =
    { 0, 4, 8, 16, 32, 64, 128, 192 };
  static const unsigned char shortbits[] =
    { 2, 2, 3, 4, 5, 6, 6, 6 };

  int symbol, offs, len, offsindex, lensymbol, i, offssymbol, lowoffsetsymbol;
  unsigned char newfile;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);

  if (rar->filters.filterstart < end)
    end = rar->filters.filterstart;

  while (1)
  {
    if(lzss_position(&rar->lzss) >= end)
      return end;

    if(rar->is_ppmd_block)
      return lzss_position(&rar->lzss);

    if ((symbol = read_next_symbol(a, &rar->maincode)) < 0)
      return (ARCHIVE_FATAL);

    if (symbol < 256)
    {
      lzss_emit_literal(rar, symbol);
      continue;
    }
    else if (symbol == 256)
    {
      if (!rar_br_read_ahead(a, br, 1))
        goto truncated_data;
      newfile = !rar_br_bits(br, 1);
      rar_br_consume(br, 1);

      if(newfile)
      {
        rar->start_new_block = 1;
        if (!rar_br_read_ahead(a, br, 1))
          goto truncated_data;
        rar->start_new_table = rar_br_bits(br, 1);
        rar_br_consume(br, 1);
        return lzss_position(&rar->lzss);
      }
      else
      {
        if (parse_codes(a) != ARCHIVE_OK)
          return (ARCHIVE_FATAL);
        continue;
      }
    }
    else if(symbol==257)
    {
      if (!read_filter(a, &end))
          return (ARCHIVE_FATAL);
      continue;
    }
    else if(symbol==258)
    {
      if(rar->lastlength == 0)
        continue;

      offs = rar->lastoffset;
      len = rar->lastlength;
    }
    else if (symbol <= 262)
    {
      offsindex = symbol - 259;
      offs = rar->oldoffset[offsindex];

      if ((lensymbol = read_next_symbol(a, &rar->lengthcode)) < 0)
        goto bad_data;
      if (lensymbol > lengthb_min)
        goto bad_data;
      len = lengthbases[lensymbol] + 2;
      if (lengthbits[lensymbol] > 0) {
        if (!rar_br_read_ahead(a, br, lengthbits[lensymbol]))
          goto truncated_data;
        len += rar_br_bits(br, lengthbits[lensymbol]);
        rar_br_consume(br, lengthbits[lensymbol]);
      }

      for (i = offsindex; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }
    else if(symbol<=270)
    {
      offs = shortbases[symbol-263] + 1;
      if(shortbits[symbol-263] > 0) {
        if (!rar_br_read_ahead(a, br, shortbits[symbol-263]))
          goto truncated_data;
        offs += rar_br_bits(br, shortbits[symbol-263]);
        rar_br_consume(br, shortbits[symbol-263]);
      }

      len = 2;

      for(i = 3; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }
    else
    {
      if (symbol-271 > lengthb_min)
        goto bad_data;
      len = lengthbases[symbol-271]+3;
      if(lengthbits[symbol-271] > 0) {
        if (!rar_br_read_ahead(a, br, lengthbits[symbol-271]))
          goto truncated_data;
        len += rar_br_bits(br, lengthbits[symbol-271]);
        rar_br_consume(br, lengthbits[symbol-271]);
      }

      if ((offssymbol = read_next_symbol(a, &rar->offsetcode)) < 0)
        goto bad_data;
      if (offssymbol > offsetb_min)
        goto bad_data;
      offs = offsetbases[offssymbol]+1;
      if(offsetbits[offssymbol] > 0)
      {
        if(offssymbol > 9)
        {
          if(offsetbits[offssymbol] > 4) {
            if (!rar_br_read_ahead(a, br, offsetbits[offssymbol] - 4))
              goto truncated_data;
            offs += rar_br_bits(br, offsetbits[offssymbol] - 4) << 4;
            rar_br_consume(br, offsetbits[offssymbol] - 4);
          }

          if(rar->numlowoffsetrepeats > 0)
          {
            rar->numlowoffsetrepeats--;
            offs += rar->lastlowoffset;
          }
          else
          {
            if ((lowoffsetsymbol =
              read_next_symbol(a, &rar->lowoffsetcode)) < 0)
              return (ARCHIVE_FATAL);
            if(lowoffsetsymbol == 16)
            {
              rar->numlowoffsetrepeats = 15;
              offs += rar->lastlowoffset;
            }
            else
            {
              offs += lowoffsetsymbol;
              rar->lastlowoffset = lowoffsetsymbol;
            }
          }
        }
        else {
          if (!rar_br_read_ahead(a, br, offsetbits[offssymbol]))
            goto truncated_data;
          offs += rar_br_bits(br, offsetbits[offssymbol]);
          rar_br_consume(br, offsetbits[offssymbol]);
        }
      }

      if (offs >= 0x40000)
        len++;
      if (offs >= 0x2000)
        len++;

      for(i = 3; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }

    rar->lastoffset = offs;
    rar->lastlength = len;

    lzss_emit_match(rar, rar->lastoffset, rar->lastlength);
  }
truncated_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Truncated RAR file data");
  rar->valid = 0;
  return (ARCHIVE_FATAL);
bad_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Bad RAR file data");
  return (ARCHIVE_FATAL);
}